

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matdet.c
# Opt level: O3

double mat_cofact(MATRIX A,int i,int j)

{
  double dVar1;
  double dVar2;
  MATRIX a;
  double dVar3;
  
  dVar1 = signa[(j + i) % 2];
  dVar2 = A[i][j];
  a = mat_submat(A,i,j);
  dVar3 = mat_det(a);
  mat_free(a);
  return dVar3 * dVar1 * dVar2;
}

Assistant:

double mat_cofact( MATRIX A, int i, int j )
{
	double	result;

	result = signa[(i+j)%2] * A[i][j] * mat_minor(A, i, j);

	return (result);
}